

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void Curl_freeset(Curl_easy *data)

{
  uint local_14;
  dupstring i;
  Curl_easy *data_local;
  
  for (local_14 = 0; local_14 < 0x3e; local_14 = local_14 + 1) {
    (*Curl_cfree)((data->set).str[local_14]);
    (data->set).str[local_14] = (char *)0x0;
  }
  if (((byte)(data->change).field_0x20 >> 1 & 1) != 0) {
    (*Curl_cfree)((data->change).referer);
    (data->change).referer = (char *)0x0;
    (data->change).field_0x20 = (data->change).field_0x20 & 0xfd;
  }
  (data->change).referer = (char *)0x0;
  if (((data->change).field_0x20 & 1) != 0) {
    (*Curl_cfree)((data->change).url);
    (data->change).url = (char *)0x0;
    (data->change).field_0x20 = (data->change).field_0x20 & 0xfe;
  }
  (data->change).url = (char *)0x0;
  Curl_mime_cleanpart(&(data->set).mimepost);
  return;
}

Assistant:

void Curl_freeset(struct Curl_easy *data)
{
  /* Free all dynamic strings stored in the data->set substructure. */
  enum dupstring i;
  for(i = (enum dupstring)0; i < STRING_LAST; i++) {
    Curl_safefree(data->set.str[i]);
  }

  if(data->change.referer_alloc) {
    Curl_safefree(data->change.referer);
    data->change.referer_alloc = FALSE;
  }
  data->change.referer = NULL;
  if(data->change.url_alloc) {
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }
  data->change.url = NULL;

  Curl_mime_cleanpart(&data->set.mimepost);
}